

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int set_str_utf16be(archive_write *a,uchar *p,char *s,size_t l,uint16_t uf,vdc vdc)

{
  short *psVar1;
  void *pvVar2;
  bool bVar3;
  wchar_t wVar4;
  size_t n;
  int *piVar5;
  archive_write *paVar6;
  ushort uVar7;
  uint uVar8;
  uchar *p_1;
  archive_write *paVar9;
  undefined2 in_register_00000082;
  short *__s;
  long lVar10;
  
  __s = (short *)0x512e03;
  if (s != (char *)0x0) {
    __s = (short *)s;
  }
  paVar9 = (archive_write *)(l & 0xfffffffffffffffe);
  if (CONCAT22(in_register_00000082,uf) == 2) {
    pvVar2 = a->format_data;
    n = strlen((char *)__s);
    wVar4 = archive_strncpy_l((archive_string *)((long)pvVar2 + 0x48),__s,n,
                              *(archive_string_conv **)((long)pvVar2 + 0x78));
    if ((wVar4 == L'\0') || (piVar5 = __errno_location(), *piVar5 != 0xc)) {
      a = *(archive_write **)((long)pvVar2 + 0x50);
      if (paVar9 <= *(archive_write **)((long)pvVar2 + 0x50)) {
        a = paVar9;
      }
      memcpy(p,*(void **)((long)pvVar2 + 0x48),(size_t)a);
      bVar3 = true;
    }
    else {
      bVar3 = false;
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for UTF-16BE");
    }
    if (!bVar3) {
      return -0x1e;
    }
  }
  else {
    if (*__s == 0) {
      a = (archive_write *)0x0;
    }
    else {
      paVar6 = (archive_write *)0x0;
      do {
        a = (archive_write *)((long)&(paVar6->archive).magic + 2);
        psVar1 = (short *)((long)(__s + 1) + (long)paVar6);
        paVar6 = a;
      } while (*psVar1 != 0);
    }
    if (paVar9 <= a) {
      a = paVar9;
    }
    memcpy(p,__s,(size_t)a);
  }
  if (a != (archive_write *)0x0) {
    paVar6 = (archive_write *)0x0;
    do {
      uVar7 = *(ushort *)(p + (long)paVar6) << 8 | *(ushort *)(p + (long)paVar6) >> 8;
      if ((uVar7 < 0x20) ||
         ((uVar8 = uVar7 - 0x2a, uVar8 < 0x33 &&
          ((0x4000000230021U >> ((ulong)uVar8 & 0x3f) & 1) != 0)))) {
        (p + (long)paVar6)[0] = '\0';
        (p + (long)paVar6)[1] = '_';
      }
      paVar6 = (archive_write *)((long)&(paVar6->archive).magic + 2);
    } while (paVar6 < a);
    p = p + (long)paVar6;
  }
  if (paVar9 != a) {
    lVar10 = (long)a - (long)paVar9;
    do {
      p[0] = '\0';
      p[1] = ' ';
      p = p + 2;
      lVar10 = lVar10 + 2;
    } while (lVar10 != 0);
  }
  if ((l & 1) != 0) {
    *p = '\0';
  }
  return 0;
}

Assistant:

static int
set_str_utf16be(struct archive_write *a, unsigned char *p, const char *s,
    size_t l, uint16_t uf, enum vdc vdc)
{
	size_t size, i;
	int onepad;

	if (s == NULL)
		s = "";
	if (l & 0x01) {
		onepad = 1;
		l &= ~1;
	} else
		onepad = 0;
	if (vdc == VDC_UCS2) {
		struct iso9660 *iso9660 = a->format_data;
		if (archive_strncpy_l(&iso9660->utf16be, s, strlen(s),
		    iso9660->sconv_to_utf16be) != 0 && errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16BE");
			return (ARCHIVE_FATAL);
		}
		size = iso9660->utf16be.length;
		if (size > l)
			size = l;
		memcpy(p, iso9660->utf16be.s, size);
	} else {
		const uint16_t *u16 = (const uint16_t *)s;

		size = 0;
		while (*u16++)
			size += 2;
		if (size > l)
			size = l;
		memcpy(p, s, size);
	}
	for (i = 0; i < size; i += 2, p += 2) {
		if (!joliet_allowed_char(p[0], p[1]))
			archive_be16enc(p, 0x005F);/* '_' */
	}
	l -= size;
	while (l > 0) {
		archive_be16enc(p, uf);
		p += 2;
		l -= 2;
	}
	if (onepad)
		*p = 0;
	return (ARCHIVE_OK);
}